

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O1

Result __thiscall
wabt::interp::anon_unknown_0::BinaryReaderInterp::OnFunction
          (BinaryReaderInterp *this,Index index,Index sig_index)

{
  ModuleDesc *pMVar1;
  pointer pFVar2;
  Result RVar3;
  Enum EVar4;
  undefined1 local_d8 [16];
  vector<wabt::Type,_std::allocator<wabt::Type>_> vStack_c8;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_b0;
  pointer local_98;
  undefined4 uStack_90;
  undefined4 local_8c;
  undefined4 uStack_88;
  undefined8 uStack_84;
  Var local_78;
  
  vStack_c8.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0;
  vStack_c8.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_start._4_4_ = 0;
  vStack_c8.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0;
  local_d8._0_8_ = (_func_int **)0x0;
  local_d8._8_4_ = First;
  local_d8._12_4_ = 0;
  Var::Var(&local_78,sig_index,(Location *)local_d8);
  RVar3 = SharedValidator::OnFunction
                    (&this->validator_,(Location *)(anonymous_namespace)::BinaryReaderInterp::loc,
                     &local_78);
  Var::~Var(&local_78);
  EVar4 = Error;
  if (RVar3.enum_ != Error) {
    pMVar1 = this->module_;
    pFVar2 = (pMVar1->func_types).
             super__Vector_base<wabt::interp::FuncType,_std::allocator<wabt::interp::FuncType>_>.
             _M_impl.super__Vector_impl_data._M_start;
    local_d8._8_4_ = pFVar2[sig_index].super_ExternType.kind;
    local_d8._0_8_ = &PTR__FuncType_001a41e0;
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector
              (&vStack_c8,&pFVar2[sig_index].params);
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector
              (&local_b0,&pFVar2[sig_index].results);
    uStack_88 = 0;
    uStack_84 = 0;
    local_98 = (pointer)0x0;
    uStack_90 = 0;
    local_8c = 0;
    std::vector<wabt::interp::FuncDesc,_std::allocator<wabt::interp::FuncDesc>_>::
    emplace_back<wabt::interp::FuncDesc>(&pMVar1->funcs,(FuncDesc *)local_d8);
    if (local_98 != (pointer)0x0) {
      operator_delete(local_98);
    }
    local_d8._0_8_ = &PTR__FuncType_001a41e0;
    if (local_b0.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_b0.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if ((void *)CONCAT44(vStack_c8.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                         _M_impl.super__Vector_impl_data._M_start._4_4_,
                         vStack_c8.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                         _M_impl.super__Vector_impl_data._M_start._0_4_) != (void *)0x0) {
      operator_delete((void *)CONCAT44(vStack_c8.
                                       super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                                       _M_impl.super__Vector_impl_data._M_start._4_4_,
                                       vStack_c8.
                                       super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                                       _M_impl.super__Vector_impl_data._M_start._0_4_));
    }
    std::vector<wabt::interp::FuncType,_std::allocator<wabt::interp::FuncType>_>::push_back
              (&this->func_types_,pFVar2 + sig_index);
    EVar4 = Ok;
  }
  return (Result)EVar4;
}

Assistant:

Result BinaryReaderInterp::OnFunction(Index index, Index sig_index) {
  CHECK_RESULT(validator_.OnFunction(loc, Var(sig_index)));
  FuncType& func_type = module_.func_types[sig_index];
  module_.funcs.push_back(FuncDesc{func_type, {}, 0});
  func_types_.push_back(func_type);
  return Result::Ok;
}